

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O3

int __thiscall
CVmObjFrameDesc::getp_get_defobj(CVmObjFrameDesc *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  uint uVar1;
  vm_obj_id_t vVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  vm_obj_id_t *pvVar6;
  
  if (getp_get_defobj(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_get_defobj();
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_defobj::desc);
  if (iVar5 != 0) {
    return 1;
  }
  uVar1 = *(uint *)(this->super_CVmObject).ext_;
  plVar3 = *(long **)((long)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_ + 8);
  lVar4 = *plVar3;
  if (lVar4 == 0) {
    pvVar6 = (vm_obj_id_t *)(plVar3 + 7);
  }
  else {
    if (*(int *)(lVar4 + -0x90) != 5) {
      (retval->val).obj = 0;
      goto LAB_0028f718;
    }
    pvVar6 = (vm_obj_id_t *)(lVar4 + -0x88);
  }
  vVar2 = *pvVar6;
  retval->typ = VM_OBJ;
  (retval->val).obj = vVar2;
  if (vVar2 != 0) {
    return 1;
  }
LAB_0028f718:
  retval->typ = VM_NIL;
  return 1;
}

Assistant:

int CVmObjFrameDesc::getp_get_defobj(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                     uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get 'definingobj' from the frame */
    get_frame_ref(vmg0_)->get_defobj(vmg_ retval);

    /* handled */
    return TRUE;
}